

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O3

void __thiscall
TEST_WiningStateTest_NoHandClaim_Test::testBody(TEST_WiningStateTest_NoHandClaim_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,true);
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s,(SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report(&r,&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c)
  ;
  pUVar1 = UtestShell::getCurrent();
  local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count == 0),
             "CHECK","r.patterns.empty()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
             ,0x52,&local_b8);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
            ((TestTerminatorWithoutExceptions *)&local_b8);
  if (r.doubling_factor == 0) {
    pUVar1 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x53,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_b8);
    pcVar2 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar3 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x53,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(WiningStateTest, NoHandClaim)
{
	addNoWiningHand(true);

	selfDrawn();
	auto r = c.report();

	CHECK(r.patterns.empty());
	CHECK_EQUAL(0, r.doubling_factor);
}